

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateSnapshot.cxx
# Opt level: O1

void __thiscall cmStateSnapshot::PushPolicy(cmStateSnapshot *this,PolicyMap *entry,bool weak)

{
  cmState *pcVar1;
  PointerType pSVar2;
  iterator iVar3;
  PositionType pos;
  iterator local_68;
  PolicyStackEntry local_58;
  
  local_68.Tree = (this->Position).Tree;
  local_68.Position = (this->Position).Position;
  pcVar1 = this->State;
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
  local_58.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[4] =
       (entry->Status).super__Base_bitset<5UL>._M_w[4];
  local_58.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[0] =
       (entry->Status).super__Base_bitset<5UL>._M_w[0];
  local_58.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[1] =
       (entry->Status).super__Base_bitset<5UL>._M_w[1];
  local_58.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[2] =
       (entry->Status).super__Base_bitset<5UL>._M_w[2];
  local_58.super_PolicyMap.Status.super__Base_bitset<5UL>._M_w[3] =
       (entry->Status).super__Base_bitset<5UL>._M_w[3];
  local_58.Weak = weak;
  iVar3 = cmLinkedTree<cmStateDetail::PolicyStackEntry>::Push_impl
                    (&pcVar1->PolicyStack,pSVar2->Policies,&local_58);
  pSVar2 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->(&local_68);
  pSVar2->Policies = iVar3;
  return;
}

Assistant:

void cmStateSnapshot::PushPolicy(cmPolicies::PolicyMap const& entry, bool weak)
{
  cmStateDetail::PositionType pos = this->Position;
  pos->Policies = this->State->PolicyStack.Push(
    pos->Policies, cmStateDetail::PolicyStackEntry(entry, weak));
}